

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O2

size_t embree::sse2::GridSOA::getBVHBytes(GridRange *range,size_t nodeBytes,size_t leafBytes)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint u_size_2;
  int iVar7;
  uint u_size;
  uint uVar8;
  uint v_size;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  GridRange local_c0;
  uint local_b0 [32];
  
  local_c0.u_start = range->u_start;
  uVar4 = range->u_end;
  uVar8 = (uVar4 - local_c0.u_start) + 1;
  uVar1 = range->v_end;
  local_c0.v_start = range->v_start;
  uVar9 = (uVar1 - local_c0.v_start) + 1;
  sVar12 = leafBytes;
  if (3 < uVar8 || 3 < uVar9) {
    if (uVar8 < uVar9) {
      uVar3 = local_c0.v_start + uVar1 >> 1;
      uVar9 = (uVar3 - local_c0.v_start) + 1;
      local_c0.u_end = uVar4;
      local_c0.v_end = uVar3;
      uVar5 = local_c0.u_start;
    }
    else {
      local_c0.u_end = local_c0.u_start + uVar4 >> 1;
      uVar8 = (local_c0.u_end - local_c0.u_start) + 1;
      uVar3 = local_c0.v_start;
      local_c0.v_end = uVar1;
      uVar5 = local_c0.u_end;
    }
    if ((uVar8 < 4) && (uVar9 < 4)) {
      iVar10 = 1;
    }
    else {
      iVar10 = 2;
      local_b0[1] = local_c0.u_end;
      local_b0[3] = local_c0.v_end;
      if (uVar8 < uVar9) {
        local_b0[2] = local_c0.v_end + local_c0.v_start >> 1;
        local_c0.v_end = local_b0[2];
        local_b0[0] = local_c0.u_start;
      }
      else {
        local_c0.u_end = local_c0.u_end + local_c0.u_start >> 1;
        local_b0[0] = local_c0.u_end;
        local_b0[2] = local_c0.v_start;
      }
    }
    uVar8 = (uVar4 - uVar5) + 1;
    uVar9 = (uVar1 - uVar3) + 1;
    uVar11 = (ulong)(uint)(iVar10 << 4);
    puVar6 = (uint *)((long)&local_c0.u_start + uVar11);
    if ((uVar8 < 4) && (uVar9 < 4)) {
      iVar7 = 1;
      *puVar6 = uVar5;
      *(uint *)((long)local_b0 + (uVar11 - 0xc)) = uVar4;
      *(uint *)((long)local_b0 + (uVar11 - 8)) = uVar3;
      *(uint *)((long)local_b0 + (uVar11 - 4)) = uVar1;
    }
    else {
      *puVar6 = uVar5;
      *(uint *)((long)local_b0 + (uVar11 - 0xc)) = uVar4;
      *(uint *)((long)local_b0 + (uVar11 - 8)) = uVar3;
      *(uint *)((long)local_b0 + (uVar11 - 4)) = uVar1;
      *(uint *)((long)local_b0 + uVar11) = uVar5;
      *(uint *)((long)local_b0 + uVar11 + 4) = uVar4;
      *(uint *)((long)local_b0 + uVar11 + 8) = uVar3;
      *(uint *)((long)local_b0 + uVar11 + 0xc) = uVar1;
      if (uVar8 < uVar9) {
        uVar4 = uVar3 + uVar1 >> 1;
        *(uint *)((long)local_b0 + (uVar11 - 4)) = uVar4;
        *(uint *)((long)local_b0 + uVar11 + 8) = uVar4;
      }
      else {
        uVar4 = uVar5 + uVar4 >> 1;
        *(uint *)((long)local_b0 + (uVar11 - 0xc)) = uVar4;
        *(uint *)((long)local_b0 + uVar11) = uVar4;
      }
      iVar7 = 2;
    }
    sVar12 = nodeBytes;
    for (uVar11 = 0; (uint)((iVar10 + iVar7) * 0x10) != uVar11; uVar11 = uVar11 + 0x10) {
      sVar2 = getBVHBytes((GridRange *)((long)&local_c0.u_start + uVar11),nodeBytes,leafBytes);
      sVar12 = sVar12 + sVar2;
    }
  }
  return sVar12;
}

Assistant:

size_t GridSOA::getBVHBytes(const GridRange& range, const size_t nodeBytes, const size_t leafBytes)
    {
      if (range.hasLeafSize()) 
        return leafBytes;
      
      __aligned(64) GridRange r[4];
      const size_t children = range.splitIntoSubRanges(r);
      
      size_t bytes = nodeBytes;
      for (size_t i=0; i<children; i++)
        bytes += getBVHBytes(r[i],nodeBytes,leafBytes);
      return bytes;
    }